

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

maxint_t * primecount::S1(maxint_t *__return_storage_ptr__,maxint_t x,int threads)

{
  undefined1 x_00 [16];
  undefined1 x_01 [16];
  undefined1 x_02 [16];
  undefined1 n [16];
  bool bVar1;
  primecount *this;
  __int128 *p_Var2;
  maxint_t *pmVar3;
  primecount_error *this_00;
  int in_EDX;
  long extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined4 in_register_00000034;
  _anonymous_namespace_ *this_01;
  ulong y;
  ulong c;
  double alpha_y;
  double dVar4;
  undefined8 in_stack_ffffffffffffff88;
  _Alloc_hider in_stack_ffffffffffffff90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this_01 = (_anonymous_namespace_ *)CONCAT44(in_register_00000034,threads);
  if ((long)this_01 < (long)(ulong)(__return_storage_ptr__ == (maxint_t *)0x0)) {
    pmVar3 = (maxint_t *)0x0;
  }
  else {
    x_00._8_8_ = in_stack_ffffffffffffff90._M_p;
    x_00._0_8_ = in_stack_ffffffffffffff88;
    pmVar3 = __return_storage_ptr__;
    alpha_y = get_alpha_deleglise_rivat((primecount *)__return_storage_ptr__,(maxint_t)x_00);
    this = (primecount *)get_max_x(pmVar3,alpha_y);
    if ((SBORROW8(extraout_RDX,(long)this_01) !=
        SBORROW8(extraout_RDX - (long)this_01,(ulong)(this < __return_storage_ptr__))) !=
        (long)((extraout_RDX - (long)this_01) - (ulong)(this < __return_storage_ptr__)) < 0) {
      this_00 = (primecount_error *)__cxa_allocate_exception(0x10);
      n._8_8_ = in_stack_ffffffffffffff90._M_p;
      n._0_8_ = alpha_y;
      to_string_abi_cxx11_((string *)&stack0xffffffffffffff90,this,(int128_t)n);
      std::operator+(&local_50,"S1(x): x must be <= ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &stack0xffffffffffffff90);
      primecount_error::primecount_error(this_00,&local_50);
      __cxa_throw(this_00,&primecount_error::typeinfo,std::runtime_error::~runtime_error);
    }
    bVar1 = is_print();
    if (bVar1) {
      set_print_variables(true);
    }
    x_01._8_8_ = in_stack_ffffffffffffff90._M_p;
    x_01._0_8_ = alpha_y;
    p_Var2 = (anonymous_namespace)::iroot<3,__int128>(__return_storage_ptr__,this_01,(__int128)x_01)
    ;
    dVar4 = (double)__floattidf(p_Var2,extraout_RDX_00);
    y = (ulong)(alpha_y * dVar4);
    if (y < 0x14) {
      c = (ulong)(byte)PhiTiny::pi[y];
    }
    else {
      c = 8;
    }
    bVar1 = is_print();
    if ((long)__return_storage_ptr__ < 0 || this_01 != (_anonymous_namespace_ *)0x0) {
      x_02._8_8_ = in_stack_ffffffffffffff90._M_p;
      x_02._0_8_ = alpha_y;
      pmVar3 = S1(__return_storage_ptr__,(int128_t)x_02,(int64_t)this_01,y,(int)c,SUB41(in_EDX,0));
    }
    else {
      pmVar3 = (maxint_t *)S1((int64_t)__return_storage_ptr__,y,c,in_EDX,bVar1);
    }
  }
  return pmVar3;
}

Assistant:

maxint_t S1(maxint_t x, int threads)
{
  if (x < 1)
    return 0;

  double alpha = get_alpha_deleglise_rivat(x);
  maxint_t limit = get_max_x(alpha);

  if (x > limit)
    throw primecount_error("S1(x): x must be <= " + to_string(limit));

  if (is_print())
    set_print_variables(true);

  int64_t y = (int64_t) (iroot<3>(x) * alpha);
  int64_t c = PhiTiny::get_c(y);

  if (x <= pstd::numeric_limits<int64_t>::max())
    return S1((int64_t) x, y, c, threads);
  else
    return S1(x, y, c, threads);
}